

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  long *plVar1;
  long lVar2;
  unsigned_short *h;
  unsigned_short *h_00;
  value_type vVar3;
  ushort uVar4;
  unsigned_short *puVar5;
  size_t __n;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  unsigned_short uVar6;
  pointer plVar7;
  int i_4;
  FP32 FVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  value_type *pvVar18;
  uchar *__src;
  ushort *__dest;
  reference pvVar19;
  long *plVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  pointer pPVar24;
  value_type *pvVar25;
  ushort uVar26;
  long lVar27;
  long lVar28;
  int y_2;
  ulong uVar29;
  unsigned_short uVar30;
  short sVar31;
  uint uVar32;
  pointer puVar33;
  FP16 h_01;
  ushort uVar34;
  int iVar35;
  long lVar36;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint uVar37;
  uint uVar38;
  value_type *pvVar39;
  value_type vVar40;
  int iVar41;
  value_type *pvVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  ushort *__dest_00;
  int y;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  ushort *puVar49;
  ushort *puVar50;
  uchar *b;
  pointer pPVar51;
  bool bVar52;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000001c;
  ushort local_1f8;
  int local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator_type local_189;
  vector<long_long,_std::allocator<long_long>_> scode;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<long_long,_std::allocator<long_long>_> freq;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bitmap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> lut;
  
  lVar44 = (long)param_4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buf,x_stride * lVar44 * CONCAT44(in_stack_00000014,line_no),(allocator_type *)&tmpBuf)
  ;
  uVar48 = 0;
  uVar45 = 0;
  if (0 < param_4) {
    uVar45 = (ulong)(uint)param_4;
  }
  uVar11 = 0;
  if (0 < x_stride) {
    uVar11 = (ulong)(uint)x_stride;
  }
  lVar12 = (long)width;
  lVar36 = param_6 * lVar12 * 4;
  lVar27 = lVar12 * 4;
  lVar43 = param_6 * lVar12 * 2;
  for (; lVar28 = *(long *)CONCAT44(in_stack_0000001c,num_lines),
      uVar48 < (ulong)((((long *)CONCAT44(in_stack_0000001c,num_lines))[1] - lVar28) / 0x38);
      uVar48 = uVar48 + 1) {
    lVar2 = lVar28 + uVar48 * 0x38;
    iVar9 = *(int *)(lVar28 + 0x20 + uVar48 * 0x38);
    if (iVar9 == 2) {
      iVar9 = *(int *)(lVar2 + 0x24);
      if (iVar9 == 1) {
        lVar28 = lVar36;
        for (uVar47 = 0; uVar47 != uVar11; uVar47 = uVar47 + 1) {
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar47 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar48 * 8)) * lVar44);
          for (uVar23 = 0; uVar45 != uVar23; uVar23 = uVar23 + 1) {
            uVar22 = *(uint *)(images[uVar48] + uVar23 * 4 + lVar28);
            uVar21 = uVar22 >> 0x17;
            uVar32 = uVar21 & 0xff;
            uVar34 = (ushort)uVar32;
            if ((char)uVar21 != '\0') {
              if (uVar32 == 0xff) {
                uVar34 = ((uVar22 & 0x7fffff) != 0 | 0x3e) << 9;
              }
              else {
                uVar34 = 0x7c00;
                if (uVar32 < 0x8f) {
                  if (uVar32 < 0x71) {
                    uVar34 = 0;
                    if (uVar32 < 0x66) goto LAB_001e5f20;
                    uVar37 = uVar22 & 0x7fffff | 0x800000;
                    uVar34 = (ushort)(uVar37 >> (0x7eU - (char)uVar21 & 0x1f));
                    uVar37 = uVar37 >> (0x7d - uVar32 & 0x1f);
                  }
                  else {
                    uVar34 = ((ushort)(uVar22 >> 0xd) & 0x3ff | (ushort)((uVar21 & 0x1f) << 10)) ^
                             0x4000;
                    uVar37 = uVar22 >> 0xc;
                  }
                  uVar34 = uVar34 + ((uVar37 & 1) != 0);
                }
LAB_001e5f20:
                uVar34 = uVar34 & 0x7fff;
              }
            }
            pvVar13[uVar23 * 2] = (value_type)uVar34;
            pvVar13[uVar23 * 2 + 1] = (byte)(uVar22 >> 0x18) & 0x80 | (byte)(uVar34 >> 8);
          }
          lVar28 = lVar28 + lVar27;
        }
      }
      else {
        if (iVar9 != 2) {
LAB_001e61f9:
          if (channels !=
              (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0) {
            std::__cxx11::string::append((char *)channels);
          }
          goto LAB_001e6249;
        }
        lVar28 = lVar36;
        for (uVar47 = 0; uVar47 != uVar11; uVar47 = uVar47 + 1) {
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar47 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar48 * 8)) * lVar44);
          for (uVar23 = 0; uVar45 != uVar23; uVar23 = uVar23 + 1) {
            *(undefined4 *)(pvVar13 + uVar23 * 4) =
                 *(undefined4 *)(images[uVar48] + uVar23 * 4 + lVar28);
          }
          lVar28 = lVar28 + lVar27;
        }
      }
    }
    else if (iVar9 == 1) {
      iVar9 = *(int *)(lVar2 + 0x24);
      if (iVar9 == 2) {
        lVar28 = lVar43;
        for (uVar47 = 0; uVar47 != uVar11; uVar47 = uVar47 + 1) {
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar47 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar48 * 8)) * lVar44);
          for (uVar23 = 0; uVar45 != uVar23; uVar23 = uVar23 + 1) {
            h_01._2_2_ = 0;
            h_01.u = *(ushort *)(images[uVar48] + uVar23 * 2 + lVar28);
            FVar8 = half_to_float(h_01);
            *(FP32 *)(pvVar13 + uVar23 * 4) = FVar8;
          }
          lVar28 = lVar28 + lVar12 * 2;
        }
      }
      else {
        if (iVar9 != 1) goto LAB_001e61f9;
        lVar28 = lVar43;
        for (uVar47 = 0; uVar47 != uVar11; uVar47 = uVar47 + 1) {
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                              (&buf,(uVar47 * CONCAT44(in_stack_00000014,line_no) +
                                    *(long *)(*(long *)pixel_data_size + uVar48 * 8)) * lVar44);
          for (uVar23 = 0; uVar45 != uVar23; uVar23 = uVar23 + 1) {
            *(undefined2 *)(pvVar13 + uVar23 * 2) =
                 *(undefined2 *)(images[uVar48] + uVar23 * 2 + lVar28);
          }
          lVar28 = lVar28 + lVar12 * 2;
        }
      }
    }
    else if (iVar9 == 0) {
      lVar28 = lVar36;
      for (uVar47 = 0; uVar47 != uVar11; uVar47 = uVar47 + 1) {
        pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                            (&buf,(uVar47 * CONCAT44(in_stack_00000014,line_no) +
                                  *(long *)(*(long *)pixel_data_size + uVar48 * 8)) * lVar44);
        for (uVar23 = 0; uVar45 != uVar23; uVar23 = uVar23 + 1) {
          *(undefined4 *)(pvVar13 + uVar23 * 4) =
               *(undefined4 *)(images[uVar48] + uVar23 * 4 + lVar28);
        }
        lVar28 = lVar28 + lVar27;
      }
    }
  }
  if (compression_type != 0) {
    if ((compression_type & 0xfffffffeU) == 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&block,(CONCAT44(buf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (int)buf.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish) -
                        CONCAT44(buf.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)buf.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) * 2 + 0x100,
                 (allocator_type *)&tmpBuf);
      uVar45 = (long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start;
      pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
      uVar48 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish) -
               CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&tmpBuf,uVar48,(allocator_type *)&scode);
      pvVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      lVar44 = 0;
      for (pvVar13 = pvVar15; pvVar13 < pvVar15 + uVar48; pvVar13 = pvVar13 + 2) {
        pvVar16[lVar44] = *pvVar13;
        if (pvVar15 + uVar48 <= pvVar13 + 1) break;
        pvVar17[lVar44 + (uVar48 + 1 >> 1)] = pvVar13[1];
        lVar44 = lVar44 + 1;
      }
      pvVar18 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      vVar40 = *pvVar18;
      while (pvVar18 = pvVar18 + 1, pvVar18 < pvVar13 + uVar48) {
        vVar3 = *pvVar18;
        *pvVar18 = (vVar3 - vVar40) + 0x80;
        vVar40 = vVar3;
      }
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
      __src = stbi_zlib_compress(pvVar13,(int)uVar48,(int *)&scode,8);
      if (__src != (uchar *)0x0) {
        memcpy(pvVar14,__src,
               (long)(int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        free(__src);
        uVar45 = (long)(int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start;
        if (uVar48 <= (ulong)(long)(int)scode.
                                        super__Vector_base<long_long,_std::allocator<long_long>_>.
                                        _M_impl.super__Vector_impl_data._M_start) {
          memcpy(pvVar14,pvVar15,uVar48);
          uVar45 = uVar48;
        }
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (__src == (uchar *)0x0) {
        if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0
           ) {
          std::__cxx11::string::append((char *)channels);
        }
      }
      else {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                   (const_iterator)
                   (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uVar45 & 0xffffffff)));
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (__src != (uchar *)0x0) goto LAB_001e7085;
    }
    else if (compression_type == 0x80) {
      if (channels != (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)0x0)
      {
        std::__cxx11::string::append((char *)channels);
      }
    }
    else {
      if (compression_type == 4) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block_2,(ulong)(((int)buf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (int)buf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) * 2 + 0x2000),
                   (allocator_type *)&tmpBuf);
        __dest = (ushort *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block_2,0);
        pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        uVar48 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&bitmap,0x2000,(allocator_type *)&tmpBuf);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&tmpBuffer,uVar48 >> 1,(allocator_type *)&tmpBuf);
        std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
                  (&channelData,
                   (((long *)CONCAT44(in_stack_0000001c,num_lines))[1] -
                   *(long *)CONCAT44(in_stack_0000001c,num_lines)) / 0x38,(allocator_type *)&tmpBuf)
        ;
        pvVar19 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        lVar44 = 0x24;
        lVar36 = 0x1c;
        for (uVar45 = 0;
            uVar45 < (ulong)((long)channelData.
                                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)channelData.
                                   super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar45 = uVar45 + 1) {
          *(reference *)
           ((long)channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar36 + -0x1c) = pvVar19;
          *(reference *)
           ((long)channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar36 + -0x14) = pvVar19;
          *(int *)((long)channelData.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar36 + -0xc) = param_4;
          *(int *)((long)channelData.
                         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar36 + -8) = x_stride;
          bVar52 = *(int *)(*(long *)CONCAT44(in_stack_0000001c,num_lines) + lVar44) != 1;
          *(uint *)((long)&(channelData.
                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->start + lVar36) = bVar52 + 1
          ;
          pvVar19 = pvVar19 + (x_stride * param_4 << bVar52);
          lVar44 = lVar44 + 0x38;
          lVar36 = lVar36 + 0x20;
        }
        pPVar24 = channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar14 = pvVar13;
        pPVar51 = channelData.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (iVar9 = 0; local_1f0 = (int)uVar11, iVar9 != local_1f0; iVar9 = iVar9 + 1) {
          lVar44 = 8;
          for (uVar45 = 0; uVar45 < (ulong)((long)pPVar24 - (long)pPVar51 >> 5); uVar45 = uVar45 + 1
              ) {
            lVar36 = (long)*(int *)((long)&pPVar51->ny + lVar44) *
                     (long)*(int *)((long)&pPVar51->end + lVar44);
            __n = lVar36 * 2;
            memcpy(*(void **)((long)&pPVar51->start + lVar44),pvVar14,__n);
            pvVar14 = pvVar14 + lVar36 * 2;
            plVar20 = (long *)((long)&pPVar51->start + lVar44);
            *plVar20 = *plVar20 + __n;
            lVar44 = lVar44 + 0x20;
            pPVar24 = channelData.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pPVar51 = channelData.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        pvVar19 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
        for (lVar44 = 0; lVar44 != 0x2000; lVar44 = lVar44 + 1) {
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar44] = '\0';
        }
        uVar11 = (ulong)((long)tmpBuffer.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1;
        uVar47 = 0;
        uVar45 = uVar11 & 0xffffffff;
        if ((int)uVar11 < 1) {
          uVar45 = uVar47;
        }
        for (; uVar45 != uVar47; uVar47 = uVar47 + 1) {
          bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[pvVar19[uVar47] >> 3] =
               bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[pvVar19[uVar47] >> 3] |
               (byte)(1 << ((byte)pvVar19[uVar47] & 7));
        }
        *bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start =
             *bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfe;
        uVar45 = 0x1fff;
        uVar23 = 0;
        uVar11 = 0;
        uVar47 = 0;
        while( true ) {
          uVar29 = uVar45 & 0xffff;
          if (uVar47 == 0x2000) break;
          if (bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar47] != '\0') {
            uVar45 = uVar29;
            if (uVar47 < uVar29) {
              uVar45 = uVar47 & 0xffffffff;
            }
            uVar22 = (uint)uVar11;
            if (uVar47 < uVar29) {
              uVar22 = (uint)uVar23;
            }
            if ((ushort)uVar22 < uVar47) {
              uVar23 = uVar47 & 0xffffffff;
            }
            uVar11 = (ulong)uVar22;
            if ((ushort)uVar22 < uVar47) {
              uVar11 = uVar47 & 0xffffffff;
            }
          }
          uVar47 = uVar47 + 1;
        }
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                  (&lut,0x10000,(allocator_type *)&tmpBuf);
        uVar11 = 0;
        uVar6 = 0;
        do {
          if (uVar11 == 0) {
LAB_001e6646:
            uVar30 = uVar6;
            uVar6 = uVar6 + 1;
          }
          else {
            if (uVar11 == 0x10000) goto LAB_001e665f;
            if ((bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11 >> 3 & 0x1fffffff] >> ((uint)uVar11 & 7) &
                1) != 0) goto LAB_001e6646;
            uVar30 = 0;
          }
          lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = uVar30;
          uVar11 = uVar11 + 1;
        } while( true );
      }
      if (compression_type == 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&block,(ulong)((CONCAT44(buf.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                            (int)buf.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish) -
                                  CONCAT44(buf.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)buf.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)) * 3) >>
                          1,(allocator_type *)&tmpBuf);
        pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&block,0);
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&buf,0);
        uVar45 = CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&tmpBuf,uVar45,(allocator_type *)&scode);
        pvVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        lVar44 = 0;
        for (pvVar13 = pvVar15; pvVar13 < pvVar15 + uVar45; pvVar13 = pvVar13 + 2) {
          pvVar16[lVar44] = *pvVar13;
          if (pvVar15 + uVar45 <= pvVar13 + 1) break;
          pvVar17[lVar44 + (uVar45 + 1 >> 1)] = pvVar13[1];
          lVar44 = lVar44 + 1;
        }
        pvVar18 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        vVar40 = *pvVar18;
        while (pvVar18 = pvVar18 + 1, pvVar18 < pvVar13 + uVar45) {
          vVar3 = *pvVar18;
          *pvVar18 = (vVar3 - vVar40) + 0x80;
          vVar40 = vVar3;
        }
        pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&tmpBuf,0);
        pvVar25 = pvVar13 + (int)uVar45;
        pvVar16 = pvVar14;
        pvVar18 = pvVar13;
        while (pvVar13 < pvVar25) {
          lVar44 = 0;
          pvVar42 = pvVar18;
          do {
            pvVar39 = pvVar42;
            pvVar42 = pvVar39 + 1;
            if (pvVar25 <= pvVar42) {
              lVar44 = 1 - lVar44;
              goto LAB_001e6501;
            }
            lVar36 = lVar44 + ~(ulong)pvVar18;
            lVar44 = lVar44 + -1;
          } while ((-0x80 < (long)(pvVar13 + lVar36)) && (*pvVar13 == *pvVar42));
          lVar44 = -lVar44;
LAB_001e6501:
          if ((long)(pvVar18 + (lVar44 - (long)pvVar13)) < 3) {
            vVar40 = (char)pvVar13 - (char)pvVar42;
            lVar44 = (long)pvVar42 - (long)pvVar13;
            for (pvVar39 = pvVar39 + 3; pvVar18 = pvVar39 + -2, pvVar18 < pvVar25;
                pvVar39 = pvVar39 + 1) {
              if (((pvVar39 + -1 < pvVar25) && (*pvVar18 == pvVar39[-1])) && (pvVar39 < pvVar25)) {
                if ((0x7e < lVar44) || (*pvVar18 == *pvVar39)) break;
              }
              else if (0x7e < lVar44) break;
              vVar40 = vVar40 + 0xff;
              lVar44 = lVar44 + 1;
            }
            *pvVar16 = vVar40;
            for (; pvVar16 = pvVar16 + 1, pvVar13 < pvVar18; pvVar13 = pvVar13 + 1) {
              *pvVar16 = *pvVar13;
            }
          }
          else {
            *pvVar16 = (char)(pvVar18 + (lVar44 - (long)pvVar13)) + 0xff;
            pvVar16[1] = *pvVar13;
            pvVar16 = pvVar16 + 2;
            pvVar13 = pvVar42;
            pvVar18 = pvVar42;
          }
        }
        uVar48 = (ulong)((int)pvVar16 - (int)pvVar14);
        if (uVar45 <= uVar48) {
          memcpy(pvVar14,pvVar15,uVar45);
          uVar48 = uVar45;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
                   (const_iterator)
                   (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uVar48 & 0xffffffff)));
        this = &block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
        goto LAB_001e7080;
      }
    }
LAB_001e6249:
    bVar52 = false;
    goto LAB_001e7087;
  }
  __first._M_current._4_4_ =
       buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  __first._M_current._0_4_ =
       (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  __last._M_current._4_4_ =
       buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  __last._M_current._0_4_ =
       (int)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
             (const_iterator)
             (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,__first,__last);
  goto LAB_001e7085;
LAB_001e665f:
  pvVar19 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  local_1f8 = uVar6 - 1;
  applyLut(lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start,pvVar19,
           (int)((ulong)((long)tmpBuffer.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)tmpBuffer.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1));
  *__dest = (ushort)uVar45;
  __dest[1] = (ushort)uVar23;
  __dest_00 = __dest + 2;
  if ((ushort)uVar45 <= (ushort)uVar23) {
    lVar44 = (uVar23 & 0xffff) - uVar29;
    memcpy(__dest_00,
           bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar29,lVar44 + 1);
    __dest_00 = (ushort *)((long)__dest_00 + lVar44 + 1);
  }
  for (uVar45 = 0;
      uVar45 < (ulong)((long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)channelData.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar45 = uVar45 + 1) {
    pPVar24 = channelData.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar45;
    lVar44 = 0;
    for (lVar36 = 0; iVar9 = pPVar24->size, lVar36 < iVar9; lVar36 = lVar36 + 1) {
      puVar5 = pPVar24->start;
      uVar22 = pPVar24->nx;
      uVar21 = pPVar24->ny;
      iVar41 = uVar22 * iVar9;
      uVar32 = uVar21;
      if ((int)uVar22 < (int)uVar21) {
        uVar32 = uVar22;
      }
      uVar38 = 2;
      uVar37 = 1;
      while (uVar10 = uVar38, (int)uVar10 <= (int)uVar32) {
        iVar35 = (uVar22 - uVar10) * iVar9;
        lVar27 = (long)(int)(uVar37 * iVar9);
        lVar43 = (long)(int)(uVar37 * iVar41);
        for (puVar50 = (ushort *)((long)puVar5 + lVar44);
            puVar50 <= puVar5 + lVar36 + (int)((uVar21 - uVar10) * iVar41);
            puVar50 = puVar50 + (int)(uVar10 * iVar41)) {
          for (puVar49 = puVar50; puVar49 <= puVar50 + iVar35;
              puVar49 = puVar49 + (int)(uVar10 * iVar9)) {
            h = puVar49 + lVar43;
            h_00 = puVar49 + lVar43 + lVar27;
            uVar34 = *puVar49;
            uVar4 = puVar49[lVar27];
            if (local_1f8 < 0x4000) {
              sVar31 = *h - *h_00;
              uVar38 = (int)(short)*h_00 + (int)(short)*h;
              *puVar49 = (unsigned_short)
                         ((uint)(((int)uVar38 >> 1) + ((int)(short)uVar4 + (int)(short)uVar34 >> 1))
                         >> 1);
              *h = (short)((uint)((int)(short)uVar4 + (int)(short)uVar34) >> 1) -
                   (short)(uVar38 >> 1);
              puVar49[lVar27] =
                   (unsigned_short)((uint)((int)sVar31 + (int)(short)(uVar34 - uVar4)) >> 1);
              *h_00 = (uVar34 - uVar4) - sVar31;
            }
            else {
              uVar38 = (uVar34 ^ 0x8000) - (uint)uVar4 & 0x8000ffff;
              iVar46 = (*h ^ 0x8000) - (uint)*h_00;
              wenc16((ushort)(uVar38 >> 0x10) ^ (ushort)((uVar34 ^ 0x8000) + (uint)uVar4 >> 1),
                     (ushort)((uint)iVar46 >> 0x10) & 0x8000 ^
                     (ushort)((uint)*h_00 + (*h ^ 0x8000) >> 1),puVar49,h);
              wenc16((unsigned_short)uVar38,(unsigned_short)iVar46,puVar49 + lVar27,h_00);
            }
          }
          if ((uVar22 & uVar37) != 0) {
            uVar34 = *puVar49;
            uVar4 = puVar49[lVar43];
            if (local_1f8 < 0x4000) {
              uVar26 = (ushort)((uint)((int)(short)uVar4 + (int)(short)uVar34) >> 1);
              iVar46 = (int)(short)uVar34 - (int)(short)uVar4;
            }
            else {
              iVar46 = (uVar34 ^ 0x8000) - (uint)uVar4;
              uVar26 = (ushort)((uint)iVar46 >> 0x10) & 0x8000 ^
                       (ushort)((uVar34 ^ 0x8000) + (uint)uVar4 >> 1);
            }
            puVar49[lVar43] = (unsigned_short)iVar46;
            *puVar49 = uVar26;
          }
        }
        if ((uVar21 & uVar37) != 0) {
          puVar49 = puVar50 + iVar35;
          for (; puVar50 <= puVar49; puVar50 = puVar50 + (int)(uVar10 * iVar9)) {
            uVar34 = *puVar50;
            uVar4 = puVar50[lVar27];
            if (local_1f8 < 0x4000) {
              uVar26 = (ushort)((uint)((int)(short)uVar4 + (int)(short)uVar34) >> 1);
              iVar35 = (int)(short)uVar34 - (int)(short)uVar4;
            }
            else {
              iVar35 = (uVar34 ^ 0x8000) - (uint)uVar4;
              uVar26 = (ushort)((uint)iVar35 >> 0x10) & 0x8000 ^
                       (ushort)((uVar34 ^ 0x8000) + (uint)uVar4 >> 1);
            }
            puVar50[lVar27] = (ushort)iVar35;
            *puVar50 = uVar26;
          }
        }
        uVar37 = uVar10;
        uVar38 = uVar10 * 2;
      }
      lVar44 = lVar44 + 2;
    }
  }
  __dest_00[0] = 0;
  __dest_00[1] = 0;
  pvVar19 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&tmpBuffer,0);
  iVar41 = (int)__dest_00 + 4;
  uVar45 = (ulong)((long)tmpBuffer.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)tmpBuffer.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 1;
  iVar9 = (int)uVar45;
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&freq,0x10001,(allocator_type *)&tmpBuf);
    plVar7 = freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar44 = 0; lVar44 != 0x10001; lVar44 = lVar44 + 1) {
      freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar44] = 0;
    }
    uVar11 = 0;
    uVar47 = 0;
    if (0 < iVar9) {
      uVar47 = uVar45 & 0xffffffff;
    }
    for (; uVar47 != uVar11; uVar11 = uVar11 + 1) {
      freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
      ._M_start[pvVar19[uVar11]] =
           freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_start[pvVar19[uVar11]] + 1;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&tmpBuf,0x10001,(allocator_type *)&block);
    std::vector<long_long_*,_std::allocator<long_long_*>_>::vector
              ((vector<long_long_*,_std::allocator<long_long_*>_> *)&block,0x10001,
               (allocator_type *)&scode);
    plVar20 = plVar7 + -1;
    uVar45 = 0xffffffffffffffff;
    do {
      uVar45 = uVar45 + 1;
      plVar1 = plVar20 + 1;
      plVar20 = plVar20 + 1;
    } while (*plVar1 == 0);
    uVar47 = 0;
    iVar35 = 0;
    for (uVar11 = uVar45; lVar44 = (long)iVar35, uVar11 < 0x10001; uVar11 = uVar11 + 1) {
      *(int *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11 * 4) = (int)uVar11;
      if (*plVar20 != 0) {
        *(long **)(block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar44 * 8) = plVar20;
        iVar35 = iVar35 + 1;
        uVar47 = uVar11 & 0xffffffff;
      }
      plVar20 = plVar20 + 1;
    }
    plVar7[(long)(int)uVar47 + 1] = 1;
    *(pointer *)
     (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + lVar44 * 8) = plVar7 + (long)(int)uVar47 + 1;
    std::make_heap<long_long**,tinyexr::FHeapCompare>
              (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar44 * 8 + 8);
    std::vector<long_long,_std::allocator<long_long>_>::vector(&scode,0x10001,&local_189);
    lVar44 = (long)(int)uVar47 + 1;
    memset((void *)CONCAT44(scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start),0,0x80008);
    uVar11 = (ulong)(iVar35 + 1);
    while (1 < (int)uVar11) {
      lVar36 = *(long *)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar11 * 8);
      lVar27 = *(long *)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar11 * 8 + -8);
      uVar23 = (ulong)(lVar36 - (long)plVar7) >> 3;
      uVar47 = (ulong)(lVar27 - (long)plVar7) >> 3;
      plVar7[(int)uVar47] = plVar7[(int)uVar47] + plVar7[(int)uVar23];
      uVar11 = uVar11 - 1;
      std::push_heap<long_long**,tinyexr::FHeapCompare>
                (block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar11 * 8);
      do {
        uVar22 = (uint)uVar47;
        lVar36 = (long)(int)uVar22;
        plVar20 = (long *)(CONCAT44(scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)scode.
                                         super__Vector_base<long_long,_std::allocator<long_long>_>.
                                         _M_impl.super__Vector_impl_data._M_start) + lVar36 * 8);
        *plVar20 = *plVar20 + 1;
        uVar47 = (ulong)*(uint *)(tmpBuf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar36 * 4);
      } while (*(uint *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar36 * 4) != uVar22);
      *(int *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar36 * 4) = (int)uVar23;
      do {
        uVar22 = (uint)uVar23;
        plVar20 = (long *)(CONCAT44(scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (int)scode.
                                         super__Vector_base<long_long,_std::allocator<long_long>_>.
                                         _M_impl.super__Vector_impl_data._M_start) +
                          (long)(int)uVar22 * 8);
        *plVar20 = *plVar20 + 1;
        uVar23 = (ulong)*(uint *)(tmpBuf.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + (long)(int)uVar22 * 4);
      } while (*(uint *)(tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + (long)(int)uVar22 * 4) != uVar22
              );
    }
    hufCanonicalCodeTable
              ((longlong *)
               CONCAT44(scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                             .super__Vector_impl_data._M_start));
    memcpy(plVar7,(void *)CONCAT44(scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)scode.
                                        super__Vector_base<long_long,_std::allocator<long_long>_>.
                                        _M_impl.super__Vector_impl_data._M_start),0x80008);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&scode.super__Vector_base<long_long,_std::allocator<long_long>_>);
    std::_Vector_base<long_long_*,_std::allocator<long_long_*>_>::~_Vector_base
              ((_Vector_base<long_long_*,_std::allocator<long_long_*>_> *)&block);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&tmpBuf);
    plVar7 = freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    uVar11 = uVar45 & 0xffffffff;
    tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(__dest_00 + 0xc);
    while (uVar22 = (uint)uVar11, (int)uVar22 <= (int)lVar44) {
      uVar47 = (ulong)(int)uVar22;
      uVar11 = plVar7[uVar47] & 0x3f;
      if (uVar11 == 0) {
        uVar23 = 0x3a;
        uVar29 = 0xfffffffb;
        while( true ) {
          uVar22 = (int)uVar29 + 6;
          if (((lVar44 <= (long)uVar47) || (0x104 < uVar22)) ||
             ((*(byte *)(plVar7 + uVar47 + 1) & 0x3f) != 0)) break;
          uVar47 = uVar47 + 1;
          uVar29 = (ulong)((int)uVar29 + 1);
          uVar23 = uVar23 + 1;
        }
        if (uVar22 < 2) {
          uVar22 = (uint)uVar47;
          goto LAB_001e6dea;
        }
        iVar35 = 6;
        if (5 < uVar22) {
          outputBits(6,0x3f,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
          iVar35 = 8;
          uVar23 = uVar29;
        }
        outputBits(iVar35,uVar23,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
      }
      else {
LAB_001e6dea:
        outputBits(6,uVar11,(longlong *)&block,(int *)&scode,(char **)&tmpBuf);
        uVar47 = (ulong)uVar22;
      }
      uVar11 = (ulong)((int)uVar47 + 1);
    }
    puVar33 = tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      puVar33 = tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      *tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uchar)((long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start <<
                  (8U - (char)(int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                   _M_impl.super__Vector_impl_data._M_start & 0x3f));
    }
    block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    lVar36 = 1;
    tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar33;
    iVar35 = 0;
    while( true ) {
      uVar34 = pvVar19[lVar36 + -1];
      if (iVar9 <= lVar36) break;
      if (iVar35 < 0xff && uVar34 == pvVar19[lVar36]) {
        iVar46 = iVar35 + 1;
      }
      else {
        iVar46 = 0;
        sendCode(freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar34],iVar35,
                 freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar44],(longlong *)&block,(int *)&scode,
                 (char **)&tmpBuf);
      }
      lVar36 = lVar36 + 1;
      iVar35 = iVar46;
    }
    sendCode(freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar34],iVar35,
             freq.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar44],(longlong *)&block,(int *)&scode,
             (char **)&tmpBuf);
    if ((int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) {
      iVar9 = 0;
    }
    else {
      *tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (uchar)((long)block.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start <<
                  (8U - (char)(int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                   _M_impl.super__Vector_impl_data._M_start & 0x3f));
      iVar9 = (int)scode.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    }
    iVar46 = (int)tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start - (int)puVar33;
    *(value_type *)(__dest_00 + 2) = (value_type)uVar45;
    *(value_type *)((long)__dest_00 + 5) = (value_type)(uVar45 >> 8);
    *(value_type *)(__dest_00 + 3) = (value_type)(uVar45 >> 0x10);
    *(value_type *)((long)__dest_00 + 7) = (value_type)(uVar45 >> 0x18);
    *(value_type *)(__dest_00 + 4) = (value_type)lVar44;
    *(value_type *)((long)__dest_00 + 9) = (value_type)((ulong)lVar44 >> 8);
    *(value_type *)(__dest_00 + 5) = (value_type)((ulong)lVar44 >> 0x10);
    *(value_type *)((long)__dest_00 + 0xb) = (value_type)((ulong)lVar44 >> 0x18);
    lVar44 = (long)puVar33 - (long)(__dest_00 + 0xc);
    *(value_type *)(__dest_00 + 6) = (value_type)lVar44;
    *(value_type *)((long)__dest_00 + 0xd) = (value_type)((ulong)lVar44 >> 8);
    *(value_type *)(__dest_00 + 7) = (value_type)((ulong)lVar44 >> 0x10);
    *(value_type *)((long)__dest_00 + 0xf) = (value_type)((ulong)lVar44 >> 0x18);
    iVar35 = iVar9 + iVar46 * 8;
    *(value_type *)(__dest_00 + 8) = (value_type)iVar35;
    *(value_type *)((long)__dest_00 + 0x11) = (value_type)((uint)iVar35 >> 8);
    *(value_type *)(__dest_00 + 9) = (value_type)((uint)iVar35 >> 0x10);
    *(value_type *)((long)__dest_00 + 0x13) = (value_type)((uint)iVar35 >> 0x18);
    iVar9 = ((iVar9 + iVar46 * 8 + 7) / 8 + (int)puVar33) - iVar41;
    __dest_00[10] = 0;
    __dest_00[0xb] = 0;
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              (&freq.super__Vector_base<long_long,_std::allocator<long_long>_>);
  }
  *(int *)__dest_00 = iVar9;
  uVar45 = (ulong)(uint)((iVar41 - (int)__dest) + iVar9);
  if (uVar48 <= uVar45) {
    memcpy(__dest,pvVar13,uVar48);
    uVar45 = uVar48;
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&lut.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::
  ~_Vector_base(&channelData.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
               );
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&tmpBuffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)out_data,
             (const_iterator)
             (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + uVar45));
  this = &block_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
LAB_001e7080:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this);
LAB_001e7085:
  bVar52 = true;
LAB_001e7087:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar52;
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,                         
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}